

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMFieldList max_field_lists(FMFieldList list1,FMFieldList list2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__dest;
  FMFieldList __base;
  char *pcVar4;
  FMFieldList in_RSI;
  FMFieldList in_RDI;
  int last_field_end;
  int j;
  int i;
  int max_field_count;
  int field_count2;
  int field_count1;
  FMFieldList tlist2;
  FMFieldList max_field_list;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  int local_38;
  int local_34;
  
  iVar1 = count_FMfield(in_RDI);
  iVar2 = count_FMfield(in_RSI);
  local_34 = 0;
  __dest = ffs_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  memcpy(__dest,in_RSI,(long)iVar2 * 0x18);
  __base = (FMFieldList)ffs_malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_38 = 0;
  do {
    if (iVar1 <= local_38) {
      for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
        if (*(long *)((long)__dest + (long)iVar1 * 0x18) != 0) {
          pcVar4 = strdup(*(char **)((long)__dest + (long)iVar1 * 0x18));
          __base[local_34].field_name = pcVar4;
          pcVar4 = strdup(*(char **)((long)__dest + (long)iVar1 * 0x18 + 8));
          __base[local_34].field_type = pcVar4;
          __base[local_34].field_size = *(int *)((long)__dest + (long)iVar1 * 0x18 + 0x10);
          __base[local_34].field_offset = *(int *)((long)__dest + (long)iVar1 * 0x18 + 0x14);
          local_34 = local_34 + 1;
        }
      }
      free(__dest);
      __base[local_34].field_name = (char *)0x0;
      __base[local_34].field_type = (char *)0x0;
      __base[local_34].field_size = 0;
      __base[local_34].field_offset = 0;
      qsort(__base,(long)local_34,0x18,field_offset_compar);
      for (local_38 = 1; local_38 < local_34; local_38 = local_38 + 1) {
        iVar1 = __base[local_38 + -1].field_offset + __base[local_38 + -1].field_size;
        if (__base[local_38].field_offset < iVar1) {
          __base[local_38].field_offset = iVar1;
        }
      }
      return __base;
    }
    iVar5 = 0;
    while ((iVar5 < iVar2 &&
           ((*(long *)((long)__dest + (long)iVar5 * 0x18) == 0 ||
            (iVar3 = strcmp(in_RDI[local_38].field_name,
                            *(char **)((long)__dest + (long)iVar5 * 0x18)), iVar3 != 0))))) {
      iVar5 = iVar5 + 1;
    }
    if (iVar5 == iVar2) {
      pcVar4 = strdup(in_RDI[local_38].field_name);
      __base[local_34].field_name = pcVar4;
      pcVar4 = strdup(in_RDI[local_38].field_type);
      __base[local_34].field_type = pcVar4;
      __base[local_34].field_size = in_RDI[local_38].field_size;
      __base[local_34].field_offset = in_RDI[local_38].field_offset;
    }
    else {
      iVar3 = field_type_eq((char *)list1,(char *)list2);
      if (iVar3 == 0) {
        free(__dest);
        free(__base);
        return (FMFieldList)0x0;
      }
      pcVar4 = strdup(in_RDI[local_38].field_name);
      __base[local_34].field_name = pcVar4;
      pcVar4 = strdup(in_RDI[local_38].field_type);
      __base[local_34].field_type = pcVar4;
      if (in_RDI[local_38].field_size < *(int *)((long)__dest + (long)iVar5 * 0x18 + 0x10)) {
        local_44 = *(int *)((long)__dest + (long)iVar5 * 0x18 + 0x10);
      }
      else {
        local_44 = in_RDI[local_38].field_size;
      }
      __base[local_34].field_size = local_44;
      __base[local_34].field_offset = in_RDI[local_38].field_offset;
      *(undefined8 *)((long)__dest + (long)iVar5 * 0x18) = 0;
    }
    local_34 = local_34 + 1;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

extern
FMFieldList
max_field_lists(FMFieldList list1, FMFieldList list2)
{
    FMFieldList max_field_list = NULL;
    FMFieldList tlist2;
    int field_count1 = count_FMfield(list1);
    int field_count2 = count_FMfield(list2);
    int max_field_count = 0;
    int i, j;

    /* make a copy of list2 that we can scratch on */
    tlist2 = (FMFieldList) malloc((size_t) sizeof(FMField) * field_count2);
    memcpy(tlist2, list2, sizeof(FMField) * field_count2);

    max_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
				      (field_count1 + field_count2 + 1));

    for (i = 0; i < field_count1; i++) {
	/* for each field in list1 */
	for (j = 0; j < field_count2; j++) {
	    if (tlist2[j].field_name &&
	      (strcmp(list1[i].field_name, tlist2[j].field_name) == 0)) {
		break;
	    }
	}
	if (j == field_count2) {
	    /* field exists only in 1, use it as is */
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		list1[i].field_size;
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	} else {
	    /* field list in both.  Check types and take max size */
	    if (!field_type_eq(list1[i].field_type, tlist2[j].field_type)) {
		/* Yikes!  Types are bad!  Serious problem */
		free(tlist2);
		free(max_field_list);
		return NULL;
	    }
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		Max(list1[i].field_size, tlist2[j].field_size);
	    /* tentative offset */
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	    /* mark field in list 2 as used */
	    tlist2[j].field_name = NULL;
	}
    }
    for (j = 0; j < field_count2; j++) {
	if (tlist2[j].field_name != NULL) {
	    /* didn't mark this field as used.  Must only be in list2 */
	    max_field_list[max_field_count].field_name =
		strdup(tlist2[j].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(tlist2[j].field_type);
	    max_field_list[max_field_count].field_size =
		tlist2[j].field_size;
	    max_field_list[max_field_count].field_offset =
		tlist2[j].field_offset;
	    max_field_count++;
	}
    }
    free(tlist2);

    max_field_list[max_field_count].field_name = NULL;
    max_field_list[max_field_count].field_type = NULL;
    max_field_list[max_field_count].field_size = 0;
    max_field_list[max_field_count].field_offset = 0;

    /* sort the max list by offset now */
    qsort(max_field_list, max_field_count, sizeof(FMField),
	  field_offset_compar);
    for (i = 1; i < max_field_count; i++) {
	int last_field_end = max_field_list[i - 1].field_offset +
	max_field_list[i - 1].field_size;
	if (max_field_list[i].field_offset < last_field_end) {
	    /* damn, got some overlap.  Push this field up to fix. */
	    max_field_list[i].field_offset = last_field_end;
	}
    }
    return max_field_list;
}